

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O0

_Bool dice_parse_string(dice_t *dice,char *string)

{
  bool bVar1;
  dice_input_t input;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  bool local_5d;
  int local_5c;
  _Bool is_variable;
  int value;
  dice_input_t input_type;
  dice_state_t dStack_4c;
  _Bool flush;
  last_seen_e last_seen;
  dice_state_t state;
  size_t current;
  size_t token_end;
  char token [17];
  char *string_local;
  dice_t *dice_local;
  
  unique0x1000026d = string;
  memset(&token_end,0,0x11);
  current = 0;
  dStack_4c = DICE_STATE_START;
  input_type = DICE_INPUT_AMP;
  if ((dice == (dice_t *)0x0) || (stack0xffffffffffffffe0 == (char *)0x0)) {
    dice_local._7_1_ = false;
  }
  else {
    dice_reset(dice);
    for (_last_seen = 0; sVar2 = strlen(stack0xffffffffffffffe0), _last_seen <= sVar2;
        _last_seen = _last_seen + 1) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)stack0xffffffffffffffe0[_last_seen]] & 0x2000) == 0) {
        input = dice_input_for_char(stack0xffffffffffffffe0[_last_seen]);
        if (input == DICE_INPUT_AMP) {
LAB_00285323:
          dStack_4c = dice_parse_state_transition(dStack_4c,input);
        }
        else if (input == DICE_INPUT_MINUS) {
LAB_00285333:
          if (current < 0x10) {
            token[current - 8] = stack0xffffffffffffffe0[_last_seen];
            current = current + 1;
          }
          dStack_4c = dice_parse_state_transition(dStack_4c,input);
        }
        else {
          if ((input - DICE_INPUT_BASE < 2) || (input == DICE_INPUT_VAR)) goto LAB_00285323;
          if (input - DICE_INPUT_DIGIT < 2) goto LAB_00285333;
          if (input == DICE_INPUT_NULL) goto LAB_00285323;
        }
        if (stack0xffffffffffffffe0[_last_seen] == 'M') {
          if ((dStack_4c == DICE_STATE_VAR) || (dStack_4c == DICE_STATE_VAR_CHAR)) {
            if (current < 0x10) {
              token[current - 8] = stack0xffffffffffffffe0[_last_seen];
              current = current + 1;
            }
            dStack_4c = dice_parse_state_transition(dStack_4c,DICE_INPUT_UPPER);
          }
          else {
            dStack_4c = dice_parse_state_transition(dStack_4c,DICE_INPUT_BONUS);
          }
        }
        else if (stack0xffffffffffffffe0[_last_seen] == 'm') {
          dStack_4c = dice_parse_state_transition(dStack_4c,DICE_INPUT_BONUS);
        }
        if (DICE_STATE_FLUSH_ALL < dStack_4c) {
          return false;
        }
        bVar1 = true;
        switch(dStack_4c) {
        case DICE_STATE_FLUSH_BASE:
          input_type = DICE_INPUT_MINUS;
          break;
        default:
          bVar1 = false;
          break;
        case DICE_STATE_FLUSH_DICE:
          input_type = DICE_INPUT_BASE;
          sVar2 = strlen((char *)&token_end);
          if (sVar2 == 0) {
            token_end._0_1_ = '1';
            token_end._1_1_ = 0;
          }
          break;
        case DICE_STATE_FLUSH_SIDE:
          input_type = DICE_INPUT_DICE;
          break;
        case DICE_STATE_BONUS:
          if (input_type == DICE_INPUT_BASE) {
            input_type = DICE_INPUT_DICE;
          }
          else {
            input_type = DICE_INPUT_BONUS;
          }
          break;
        case DICE_STATE_FLUSH_BONUS:
          input_type = DICE_INPUT_BONUS;
          break;
        case DICE_STATE_FLUSH_ALL:
          if (input_type < DICE_INPUT_BONUS) {
            input_type = input_type + DICE_INPUT_MINUS;
          }
        }
        if ((bVar1) && (sVar2 = strlen((char *)&token_end), sVar2 != 0)) {
          ppuVar3 = __ctype_b_loc();
          local_5d = ((*ppuVar3)[(int)(char)token_end] & 0x100) == 0;
          if (local_5d) {
            lVar4 = strtol((char *)&token_end,(char **)0x0,0);
            local_5c = (int)lVar4;
          }
          else {
            local_5c = dice_add_variable(dice,(char *)&token_end);
          }
          local_5d = !local_5d;
          switch(input_type) {
          case DICE_INPUT_MINUS:
            dice->b = local_5c;
            dice->ex_b = local_5d;
            break;
          case DICE_INPUT_BASE:
            dice->x = local_5c;
            dice->ex_x = local_5d;
            break;
          case DICE_INPUT_DICE:
            dice->y = local_5c;
            dice->ex_y = local_5d;
            break;
          case DICE_INPUT_BONUS:
            dice->m = local_5c;
            dice->ex_m = local_5d;
          }
          memset(&token_end,0,0x11);
          current = 0;
        }
      }
    }
    dice_local._7_1_ = true;
  }
  return dice_local._7_1_;
}

Assistant:

bool dice_parse_string(dice_t *dice, const char *string)
{
	char token[DICE_TOKEN_SIZE + 1] = { '\0' };
	size_t token_end = 0;
	size_t current = 0;
	dice_state_t state = 0;

	/* We need to keep track of the last thing we saw, since the parser isn't complex. */
	enum last_seen_e {
		DICE_SEEN_NONE,
		DICE_SEEN_BASE,
		DICE_SEEN_DICE,
		DICE_SEEN_SIDE,
		DICE_SEEN_BONUS,
	} last_seen = DICE_SEEN_NONE;

	if (dice == NULL || string == NULL)
		return false;

	/* Reset all internal state, since this object might be reused. */
	dice_reset(dice);

	/* Note that we are including the string terminator as part of the parse. */
	for (current = 0; current <= strlen(string); current++) {
		bool flush;
		dice_input_t input_type = DICE_INPUT_MAX;

		/* Skip spaces; this will concatenate digits and variable names. */
		if (isspace(string[current]))
			continue;

		input_type = dice_input_for_char(string[current]);

		/*
		 * Get the next state, based on the type of input char. If it's a
		 * possible number or varible name, we'll store the character in the
		 * token buffer.
		 */
		switch (input_type) {
			case DICE_INPUT_AMP:
			case DICE_INPUT_BASE:
			case DICE_INPUT_DICE:
			case DICE_INPUT_VAR:
			case DICE_INPUT_NULL:
				state = dice_parse_state_transition(state, input_type);
				break;

			case DICE_INPUT_MINUS:
			case DICE_INPUT_DIGIT:
			case DICE_INPUT_UPPER:
				/* Truncate tokens if they are too long to fit. */
				if (token_end < DICE_TOKEN_SIZE) {
					token[token_end] = string[current];
					token_end++;
				}

				state = dice_parse_state_transition(state, input_type);
				break;

			default:
				break;
		}

		/*
		 * Allow 'M' to be used as the bonus marker and to be used in variable
		 * names.
		 * Ideally, 'm' should be the only marker and this could go away by
		 * adding a case to the switch above for DICE_INPUT_BONUS
		 * (underneath DICE_INPUT_NULL).
		 */
		if (string[current] == 'M') {
			if (state == DICE_STATE_VAR || state == DICE_STATE_VAR_CHAR) {
				if (token_end < DICE_TOKEN_SIZE) {
					token[token_end] = string[current];
					token_end++;
				}

				state = dice_parse_state_transition(state, DICE_INPUT_UPPER);
			}
			else
				state = dice_parse_state_transition(state, DICE_INPUT_BONUS);
		}
		else if (string[current] == 'm') {
			state = dice_parse_state_transition(state, DICE_INPUT_BONUS);
		}

		/* Illegal transition. */
		if (state >= DICE_STATE_MAX)
			return false;

		/*
		 * Default flushing to true, since there are more states that don't
		 * need to be flushed. For some states, we need to do a bit of extra
		 * work, since the parser isn't that complex. A more complex parser
		 * would have more explicit states for variable names.
		 */
		flush = true;

		switch (state) {
			case DICE_STATE_FLUSH_BASE:
				last_seen = DICE_SEEN_BASE;
				break;

			case DICE_STATE_FLUSH_DICE:
				last_seen = DICE_SEEN_DICE;
				/* If we see a 'd' without a number before it, we assume it
				 * to be one die. */
				if (strlen(token) == 0) {
					token[0] = '1';
					token[1] = '\0';
				}
				break;

			case DICE_STATE_FLUSH_SIDE:
				last_seen = DICE_SEEN_SIDE;
				break;

			case DICE_STATE_FLUSH_BONUS:
				last_seen = DICE_SEEN_BONUS;
				break;

			case DICE_STATE_FLUSH_ALL:
				/* Flushing all means that we are flushing whatever comes after
				 * it was that we last saw. */
				if (last_seen < DICE_SEEN_BONUS)
					last_seen++;
				break;

			case DICE_STATE_BONUS:
				/* The bonus state is weird, so if we last saw dice, we're now
				 * seeing sides. */
				if (last_seen == DICE_SEEN_DICE)
					last_seen = DICE_SEEN_SIDE;
				else
					last_seen = DICE_SEEN_BONUS;
				break;

			default:
				/* We're in a state that shouldn't flush anything. */
				flush = false;
				break;
		}

		/*
		 * If we have a token that we need to flush, put it where it needs to
		 * go in the dice object. If the token is an uppercase letter, it's
		 * a variable and needs to go in the expression table. Otherwise, we
		 * try to parse it as a number, where it is set directly as a value.
		 */
		if (flush && strlen(token) > 0) {
			int value = 0;
			bool is_variable = false;

			if (isupper(token[0])) {
				value = dice_add_variable(dice, token);
				is_variable = true;
			}
			else {
				value = (int)strtol(token, NULL, 0);
				is_variable = false;
			}

			switch (last_seen) {
				case DICE_SEEN_BASE:
					dice->b = value;
					dice->ex_b = is_variable;
					break;
				case DICE_SEEN_DICE:
					dice->x = value;
					dice->ex_x = is_variable;
					break;
				case DICE_SEEN_SIDE:
					dice->y = value;
					dice->ex_y = is_variable;
					break;
				case DICE_SEEN_BONUS:
					dice->m = value;
					dice->ex_m = is_variable;
					break;
				default:
					break;
			}

			memset(token, 0, DICE_TOKEN_SIZE + 1);
			token_end = 0;
		}
	}

	return true;
}